

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uint32_t __thiscall jpgd::jpeg_decoder::H2V2ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint8 uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint8 *puVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint8_t (*pauVar32) [4];
  uint8 *puVar33;
  uint local_208;
  uint local_204;
  uint local_1a8;
  uint local_1a4;
  uint local_18c;
  int bc_4;
  int gc_4;
  int rc_4;
  int cr_4;
  int cb_4;
  uint8_t *pMuls_4;
  int cr11_sample_1;
  int cb11_sample_1;
  int cr10_sample_1;
  int cb10_sample_1;
  int b_1;
  int cr01_sample_1;
  int cb01_sample_1;
  int cr00_sample_1;
  int cb00_sample_1;
  int a_1;
  int c_x1_1;
  int c_x0_1;
  int y_sample;
  int x_1;
  int bc_3;
  int gc_3;
  int rc_3;
  int cr_3;
  int cb_3;
  uint8_t *pMuls_3;
  int bc_2;
  int gc_2;
  int rc_2;
  int cr_2;
  int cb_2;
  uint8_t *pMuls_2;
  int nx;
  int bc_1;
  int gc_1;
  int rc_1;
  int cr_1;
  int cb_1;
  uint8_t *pMuls_1;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  uint8_t *pMuls;
  int cr11_sample;
  int cb11_sample;
  int cr10_sample;
  int cb10_sample;
  int b;
  int cr01_sample;
  int cb01_sample;
  int cr00_sample;
  int cb00_sample;
  int a;
  int c_x1;
  int c_x0;
  int y_sample1;
  int y_sample0;
  int k;
  int x;
  int y_sample_base_ofs1;
  uint8 *d1;
  int half_image_x_size;
  int y1_base;
  int y0_base;
  int y_sample_base_ofs;
  uint8_t *p_C0Samples;
  uint8_t *p_YSamples;
  int c_y1;
  int c_y0;
  uint8 *d0;
  int half_image_y_size;
  int row;
  int y;
  uint BLOCKS_PER_MCU;
  jpeg_decoder *this_local;
  
  uVar23 = this->m_image_y_size - this->m_total_lines_left;
  uVar24 = uVar23 & 0xf;
  local_18c = (this->m_image_y_size >> 1) - 1;
  _c_y1 = this->m_pScan_line_0;
  uVar9 = (int)(uVar23 - 1) >> 1;
  if ((int)(uVar9 + 1) < (int)local_18c) {
    local_18c = uVar9 + 1;
  }
  p_C0Samples = this->m_pSample_buf;
  _y0_base = this->m_pSample_buf;
  if ((-1 < (int)uVar9) && (((uVar24 == 0 || (uVar24 == 0xf)) && (1 < this->m_total_lines_left)))) {
    if ((int)uVar23 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x771,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if ((this->m_sample_buf_prev_valid & 1U) == 0) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x772,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (uVar24 == 0xf) {
      p_C0Samples = this->m_pSample_buf_prev;
    }
    _y0_base = this->m_pSample_buf_prev;
  }
  iVar25 = 0;
  if ((uVar23 & 8) != 0) {
    iVar25 = 0x80;
  }
  iVar25 = iVar25 + (uVar23 & 7) * 8;
  iVar26 = (uVar9 & 7) * 8 + 0x100;
  iVar27 = (local_18c & 7) * 8 + 0x100;
  uVar10 = (this->m_image_x_size >> 1) - 1;
  if ((uVar24 == 0) || (0xe < uVar24)) {
    for (c_x0_1 = 0; c_x0_1 < this->m_image_x_size; c_x0_1 = c_x0_1 + 1) {
      iVar11 = 0;
      if ((c_x0_1 & 8U) != 0) {
        iVar11 = 0x40;
      }
      iVar11 = check_sample_buf_ofs(this,(c_x0_1 >> 4) * 0x180 + iVar11 + (c_x0_1 & 7U) + iVar25);
      uVar9 = (uint)p_C0Samples[iVar11];
      local_208 = c_x0_1 + -1 >> 1;
      local_204 = uVar10;
      if ((int)(local_208 + 1) < (int)uVar10) {
        local_204 = local_208 + 1;
      }
      if ((int)local_208 < 1) {
        local_208 = 0;
      }
      iVar11 = ((int)local_208 >> 3) * 0x180 + (local_208 & 7);
      iVar12 = check_sample_buf_ofs(this,iVar11 + iVar26);
      bVar1 = _y0_base[iVar12];
      iVar12 = check_sample_buf_ofs(this,iVar11 + iVar26 + 0x40);
      bVar2 = _y0_base[iVar12];
      puVar22 = this->m_pSample_buf;
      iVar12 = check_sample_buf_ofs(this,iVar11 + iVar27);
      bVar3 = puVar22[iVar12];
      puVar22 = this->m_pSample_buf;
      iVar11 = check_sample_buf_ofs(this,iVar11 + iVar27 + 0x40);
      bVar4 = puVar22[iVar11];
      iVar11 = ((int)local_204 >> 3) * 0x180 + (local_204 & 7);
      iVar12 = check_sample_buf_ofs(this,iVar11 + iVar26);
      bVar5 = _y0_base[iVar12];
      iVar12 = check_sample_buf_ofs(this,iVar11 + iVar26 + 0x40);
      bVar6 = _y0_base[iVar12];
      puVar22 = this->m_pSample_buf;
      iVar12 = check_sample_buf_ofs(this,iVar11 + iVar27);
      bVar7 = puVar22[iVar12];
      puVar22 = this->m_pSample_buf;
      iVar11 = check_sample_buf_ofs(this,iVar11 + iVar27 + 0x40);
      pauVar32 = H2V2ConvertFiltered::s_muls[(int)(uVar23 & 1)] + (int)(c_x0_1 & 1);
      iVar13 = (int)((uint)bVar1 * (uint)(*pauVar32)[0] + (uint)bVar3 * (uint)(*pauVar32)[1] +
                     (uint)bVar5 * (uint)(*pauVar32)[2] + (uint)bVar7 * (uint)(*pauVar32)[3] + 8) >>
               4;
      iVar29 = (int)((uint)bVar2 * (uint)(*pauVar32)[0] + (uint)bVar4 * (uint)(*pauVar32)[1] +
                     (uint)bVar6 * (uint)(*pauVar32)[2] +
                     (uint)puVar22[iVar11] * (uint)(*pauVar32)[3] + 8) >> 4;
      iVar11 = this->m_crg[iVar29];
      iVar12 = this->m_cbg[iVar13];
      iVar13 = this->m_cbb[iVar13];
      uVar8 = clamp(uVar9 + this->m_crr[iVar29]);
      *_c_y1 = uVar8;
      uVar8 = clamp(uVar9 + (iVar11 + iVar12 >> 0x10));
      _c_y1[1] = uVar8;
      uVar8 = clamp(uVar9 + iVar13);
      _c_y1[2] = uVar8;
      _c_y1[3] = 0xff;
      _c_y1 = _c_y1 + 4;
    }
    this_local._4_4_ = 1;
  }
  else {
    if ((uVar23 & 1) != 1) {
      __assert_fail("(row & 1) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x788,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if ((int)uVar23 >> 1 != uVar9) {
      __assert_fail("((y + 1 - 1) >> 1) == c_y0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x789,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (p_C0Samples != this->m_pSample_buf) {
      __assert_fail("p_YSamples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x78b,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (_y0_base != this->m_pSample_buf) {
      __assert_fail("p_C0Samples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                    ,0x78c,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    _x = this->m_pScan_line_1;
    iVar11 = 0;
    if ((uVar24 + 1 & 8) != 0) {
      iVar11 = 0x80;
    }
    iVar11 = iVar11 + (uVar24 + 1 & 7) * 8;
    for (y_sample0 = 0; y_sample0 < this->m_image_x_size; y_sample0 = y_sample0 + 1) {
      iVar12 = 0;
      if ((y_sample0 & 8U) != 0) {
        iVar12 = 0x40;
      }
      iVar12 = (y_sample0 >> 4) * 0x180 + iVar12 + (y_sample0 & 7U);
      iVar13 = check_sample_buf_ofs(this,iVar12 + iVar25);
      uVar9 = (uint)p_C0Samples[iVar13];
      iVar12 = check_sample_buf_ofs(this,iVar12 + iVar11);
      uVar14 = (uint)p_C0Samples[iVar12];
      local_1a8 = y_sample0 + -1 >> 1;
      local_1a4 = uVar10;
      if ((int)(local_1a8 + 1) < (int)uVar10) {
        local_1a4 = local_1a8 + 1;
      }
      if ((int)local_1a8 < 1) {
        local_1a8 = 0;
      }
      iVar12 = ((int)local_1a8 >> 3) * 0x180 + (local_1a8 & 7);
      iVar13 = check_sample_buf_ofs(this,iVar12 + iVar26);
      uVar15 = (uint)_y0_base[iVar13];
      iVar13 = check_sample_buf_ofs(this,iVar12 + iVar26 + 0x40);
      uVar16 = (uint)_y0_base[iVar13];
      puVar22 = this->m_pSample_buf;
      iVar13 = check_sample_buf_ofs(this,iVar12 + iVar27);
      uVar17 = (uint)puVar22[iVar13];
      puVar22 = this->m_pSample_buf;
      iVar12 = check_sample_buf_ofs(this,iVar12 + iVar27 + 0x40);
      uVar18 = (uint)puVar22[iVar12];
      iVar12 = ((int)local_1a4 >> 3) * 0x180 + (local_1a4 & 7);
      iVar13 = check_sample_buf_ofs(this,iVar12 + iVar26);
      uVar19 = (uint)_y0_base[iVar13];
      iVar13 = check_sample_buf_ofs(this,iVar12 + iVar26 + 0x40);
      uVar20 = (uint)_y0_base[iVar13];
      puVar22 = this->m_pSample_buf;
      iVar13 = check_sample_buf_ofs(this,iVar12 + iVar27);
      uVar21 = (uint)puVar22[iVar13];
      puVar22 = this->m_pSample_buf;
      iVar12 = check_sample_buf_ofs(this,iVar12 + iVar27 + 0x40);
      uVar28 = (uint)puVar22[iVar12];
      pauVar32 = H2V2ConvertFiltered::s_muls[(int)(uVar23 & 1)] + (int)(y_sample0 & 1);
      iVar29 = (int)(uVar15 * (*pauVar32)[0] + uVar17 * (*pauVar32)[1] + uVar19 * (*pauVar32)[2] +
                     uVar21 * (*pauVar32)[3] + 8) >> 4;
      iVar30 = (int)(uVar16 * (*pauVar32)[0] + uVar18 * (*pauVar32)[1] + uVar20 * (*pauVar32)[2] +
                     uVar28 * (*pauVar32)[3] + 8) >> 4;
      iVar12 = this->m_crg[iVar30];
      iVar13 = this->m_cbg[iVar29];
      iVar29 = this->m_cbb[iVar29];
      uVar8 = clamp(uVar9 + this->m_crr[iVar30]);
      *_c_y1 = uVar8;
      uVar8 = clamp(uVar9 + (iVar12 + iVar13 >> 0x10));
      _c_y1[1] = uVar8;
      uVar8 = clamp(uVar9 + iVar29);
      _c_y1[2] = uVar8;
      _c_y1[3] = 0xff;
      puVar33 = _c_y1 + 4;
      pauVar32 = H2V2ConvertFiltered::s_muls[(int)(uVar24 + 1 & 1)] + (int)(y_sample0 & 1);
      iVar29 = (int)(uVar15 * (*pauVar32)[0] + uVar17 * (*pauVar32)[1] + uVar19 * (*pauVar32)[2] +
                     uVar21 * (*pauVar32)[3] + 8) >> 4;
      iVar30 = (int)(uVar16 * (*pauVar32)[0] + uVar18 * (*pauVar32)[1] + uVar20 * (*pauVar32)[2] +
                     uVar28 * (*pauVar32)[3] + 8) >> 4;
      iVar12 = this->m_crg[iVar30];
      iVar13 = this->m_cbg[iVar29];
      iVar29 = this->m_cbb[iVar29];
      uVar8 = clamp(uVar14 + this->m_crr[iVar30]);
      *_x = uVar8;
      uVar8 = clamp(uVar14 + (iVar12 + iVar13 >> 0x10));
      _x[1] = uVar8;
      uVar8 = clamp(uVar14 + iVar29);
      _x[2] = uVar8;
      _x[3] = 0xff;
      puVar22 = _x + 4;
      if (((y_sample0 & 1U) == 1) && (y_sample0 < this->m_image_x_size + -1)) {
        uVar9 = y_sample0 + 1;
        if (local_1a8 != y_sample0 >> 1) {
          __assert_fail("c_x0 == (nx - 1) >> 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                        ,0x7ce,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
        }
        iVar12 = 0;
        if ((uVar9 & 8) != 0) {
          iVar12 = 0x40;
        }
        iVar12 = ((int)uVar9 >> 4) * 0x180 + iVar12 + (uVar9 & 7);
        iVar13 = check_sample_buf_ofs(this,iVar12 + iVar25);
        uVar14 = (uint)p_C0Samples[iVar13];
        iVar12 = check_sample_buf_ofs(this,iVar12 + iVar11);
        uVar31 = (uint)p_C0Samples[iVar12];
        pauVar32 = H2V2ConvertFiltered::s_muls[(int)(uVar23 & 1)] + (int)(uVar9 & 1);
        iVar29 = (int)(uVar15 * (*pauVar32)[0] + uVar17 * (*pauVar32)[1] + uVar19 * (*pauVar32)[2] +
                       uVar21 * (*pauVar32)[3] + 8) >> 4;
        iVar30 = (int)(uVar16 * (*pauVar32)[0] + uVar18 * (*pauVar32)[1] + uVar20 * (*pauVar32)[2] +
                       uVar28 * (*pauVar32)[3] + 8) >> 4;
        iVar12 = this->m_crg[iVar30];
        iVar13 = this->m_cbg[iVar29];
        iVar29 = this->m_cbb[iVar29];
        uVar8 = clamp(uVar14 + this->m_crr[iVar30]);
        *puVar33 = uVar8;
        uVar8 = clamp(uVar14 + (iVar12 + iVar13 >> 0x10));
        _c_y1[5] = uVar8;
        uVar8 = clamp(uVar14 + iVar29);
        _c_y1[6] = uVar8;
        _c_y1[7] = 0xff;
        pauVar32 = H2V2ConvertFiltered::s_muls[(int)(uVar24 + 1 & 1)] + (int)(uVar9 & 1);
        iVar29 = (int)(uVar15 * (*pauVar32)[0] + uVar17 * (*pauVar32)[1] + uVar19 * (*pauVar32)[2] +
                       uVar21 * (*pauVar32)[3] + 8) >> 4;
        iVar30 = (int)(uVar16 * (*pauVar32)[0] + uVar18 * (*pauVar32)[1] + uVar20 * (*pauVar32)[2] +
                       uVar28 * (*pauVar32)[3] + 8) >> 4;
        iVar12 = this->m_crg[iVar30];
        iVar13 = this->m_cbg[iVar29];
        iVar29 = this->m_cbb[iVar29];
        uVar8 = clamp(uVar31 + this->m_crr[iVar30]);
        *puVar22 = uVar8;
        uVar8 = clamp(uVar31 + (iVar12 + iVar13 >> 0x10));
        _x[5] = uVar8;
        uVar8 = clamp(uVar31 + iVar29);
        _x[6] = uVar8;
        _x[7] = 0xff;
        y_sample0 = y_sample0 + 1;
        puVar22 = _x + 8;
        puVar33 = _c_y1 + 8;
      }
      _c_y1 = puVar33;
      _x = puVar22;
    }
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t jpeg_decoder::H2V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 6;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 128 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 256;
		const int y1_base = (c_y1 & 7) * 8 + 256;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;

		static const uint8_t s_muls[2][2][4] =
		{
			{ { 1, 3, 3, 9 }, { 3, 9, 1, 3 }, },
			{ { 3, 1, 9, 3 }, { 9, 3, 3, 1 } }
		};

		if (((row & 15) >= 1) && ((row & 15) <= 14))
		{
			assert((row & 1) == 1);
			assert(((y + 1 - 1) >> 1) == c_y0);

			assert(p_YSamples == m_pSample_buf);
			assert(p_C0Samples == m_pSample_buf);

			uint8* d1 = m_pScan_line_1;
			const int y_sample_base_ofs1 = (((row + 1) & 8) ? 128 : 0) + ((row + 1) & 7) * 8;

			for (int x = 0; x < m_image_x_size; x++)
			{
				int k = (x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7);
				int y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
				int y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				{
					const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d0[0] = clamp(y_sample0 + rc);
					d0[1] = clamp(y_sample0 + gc);
					d0[2] = clamp(y_sample0 + bc);
					d0[3] = 255;

					d0 += 4;
				}

				{
					const uint8_t* pMuls = &s_muls[(row + 1) & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d1[0] = clamp(y_sample1 + rc);
					d1[1] = clamp(y_sample1 + gc);
					d1[2] = clamp(y_sample1 + bc);
					d1[3] = 255;

					d1 += 4;
				}

				if (((x & 1) == 1) && (x < m_image_x_size - 1))
				{
					const int nx = x + 1;
					assert(c_x0 == (nx - 1) >> 1);

					k = (nx >> 4) * BLOCKS_PER_MCU * 64 + ((nx & 8) ? 64 : 0) + (nx & 7);
					y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
					y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

					{
						const uint8_t* pMuls = &s_muls[row & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d0[0] = clamp(y_sample0 + rc);
						d0[1] = clamp(y_sample0 + gc);
						d0[2] = clamp(y_sample0 + bc);
						d0[3] = 255;

						d0 += 4;
					}

					{
						const uint8_t* pMuls = &s_muls[(row + 1) & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d1[0] = clamp(y_sample1 + rc);
						d1[1] = clamp(y_sample1 + gc);
						d1[2] = clamp(y_sample1 + bc);
						d1[3] = 255;

						d1 += 4;
					}

					++x;
				}
			}

			return 2;
		}
		else
		{
			for (int x = 0; x < m_image_x_size; x++)
			{
				int y_sample = p_YSamples[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + y_sample_base_ofs)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
				int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
				int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				d0[0] = clamp(y_sample + rc);
				d0[1] = clamp(y_sample + gc);
				d0[2] = clamp(y_sample + bc);
				d0[3] = 255;

				d0 += 4;
			}

			return 1;
		}
	}